

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inftrees.c
# Opt level: O2

int inflate_table(codetype type,unsigned_short *lens,uint codes,code **table,uint *bits,
                 unsigned_short *work)

{
  ushort *puVar1;
  code *pcVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  long lVar6;
  ulong uVar7;
  ulong uVar8;
  ulong uVar9;
  byte bVar10;
  byte bVar11;
  uint uVar12;
  uint uVar13;
  uint uVar14;
  uint uVar15;
  int iVar16;
  ushort uVar17;
  int iVar18;
  uint uVar19;
  uint uVar20;
  code *pcVar21;
  uchar uVar22;
  uint uVar23;
  ulong uVar24;
  uint local_c0;
  unsigned_short *local_b0;
  unsigned_short *local_a8;
  ushort auStack_88 [16];
  uint *local_68;
  unsigned_short *local_60;
  ushort auStack_58 [12];
  unsigned_short count [16];
  
  for (lVar6 = 0; lVar6 != 0x10; lVar6 = lVar6 + 1) {
    auStack_88[lVar6] = 0;
  }
  for (uVar7 = 0; codes != uVar7; uVar7 = uVar7 + 1) {
    auStack_88[lens[uVar7]] = auStack_88[lens[uVar7]] + 1;
  }
  uVar23 = 0xf;
  do {
    uVar3 = uVar23;
    if (uVar3 == 0) {
      pcVar21 = *table;
      *table = pcVar21 + 1;
      pcVar21->op = '@';
      pcVar21->bits = '\x01';
      pcVar21->val = 0;
      pcVar21 = *table;
      *table = pcVar21 + 1;
      pcVar21->op = '@';
      pcVar21->bits = '\x01';
      pcVar21->val = 0;
      uVar23 = 1;
      local_68 = bits;
LAB_00108147:
      *local_68 = uVar23;
      return 0;
    }
    uVar23 = uVar3 - 1;
  } while (auStack_88[uVar3] == 0);
  iVar16 = 1;
  uVar23 = *bits;
  if (uVar3 <= *bits) {
    uVar23 = uVar3;
  }
  for (uVar7 = 1; uVar3 != uVar7; uVar7 = uVar7 + 1) {
    if (auStack_88[uVar7] != 0) goto LAB_00108154;
  }
  uVar7 = (ulong)uVar3;
LAB_00108154:
  uVar24 = (ulong)uVar23;
  if (uVar23 <= (uint)uVar7) {
    uVar24 = uVar7 & 0xffffffff;
  }
  lVar6 = 1;
  while (lVar6 != 0x10) {
    puVar1 = auStack_88 + lVar6;
    lVar6 = lVar6 + 1;
    iVar16 = iVar16 * 2 - (uint)*puVar1;
    if (iVar16 < 0) {
      return -1;
    }
  }
  if ((iVar16 != 0) && (uVar3 != 1 || type == CODES)) {
    return -1;
  }
  auStack_58[1] = 0;
  for (lVar6 = 0; lVar6 != 0xe; lVar6 = lVar6 + 1) {
    auStack_58[lVar6 + 2] = auStack_88[lVar6 + 1] + auStack_58[lVar6 + 1];
  }
  for (uVar8 = 0; codes != uVar8; uVar8 = uVar8 + 1) {
    uVar9 = (ulong)lens[uVar8];
    if (uVar9 != 0) {
      uVar17 = auStack_58[uVar9];
      auStack_58[uVar9] = uVar17 + 1;
      work[uVar17] = (unsigned_short)uVar8;
    }
  }
  if (type == CODES) {
    uVar13 = 0x14;
    local_b0 = work;
    local_a8 = work;
  }
  else if (type == LENS) {
    uVar13 = 0x101;
    local_a8 = inflate_table::lext;
    local_b0 = inflate_table::lbase;
  }
  else {
    uVar13 = 0;
    local_a8 = inflate_table::dext;
    local_b0 = inflate_table::dbase;
  }
  uVar23 = (uint)uVar24;
  bVar10 = (byte)uVar24;
  uVar19 = 1 << (bVar10 & 0x1f);
  if ((type == LENS) && (9 < uVar23)) {
    return 1;
  }
  if ((type == DISTS) && (9 < uVar23)) {
    return 1;
  }
  local_68 = bits;
  uVar4 = uVar19 - 1;
  pcVar21 = *table;
  uVar8 = 0;
  uVar20 = 0;
  uVar15 = 0;
  local_c0 = 0xffffffff;
  local_60 = work;
  do {
    uVar5 = 1 << ((byte)uVar24 & 0x1f);
    do {
      uVar17 = local_60[uVar8];
      if (uVar17 + 1 < uVar13) {
        uVar22 = '\0';
      }
      else {
        uVar12 = uVar17 - uVar13;
        if (uVar17 < uVar13) {
          uVar22 = '`';
          uVar17 = 0;
        }
        else {
          uVar22 = (uchar)local_a8[uVar12];
          uVar17 = local_b0[uVar12];
        }
      }
      bVar11 = (char)uVar7 - (byte)uVar20;
      iVar16 = -1 << (bVar11 & 0x1f);
      uVar12 = uVar5;
      do {
        uVar14 = (uVar15 >> ((byte)uVar20 & 0x1f)) + iVar16 + uVar12;
        pcVar21[uVar14].op = uVar22;
        pcVar21[uVar14].bits = bVar11;
        pcVar21[uVar14].val = uVar17;
        uVar12 = uVar12 + iVar16;
      } while (uVar12 != 0);
      uVar12 = 1 << ((char)uVar7 - 1U & 0x1f);
      do {
        uVar14 = uVar12;
        uVar12 = uVar14 >> 1;
      } while ((uVar14 & uVar15) != 0);
      uVar15 = (uVar14 - 1 & uVar15) + uVar14;
      if (uVar14 == 0) {
        uVar15 = 0;
      }
      uVar8 = (ulong)((int)uVar8 + 1);
      puVar1 = auStack_88 + (uVar7 & 0xffffffff);
      *puVar1 = *puVar1 - 1;
      if (*puVar1 == 0) {
        if ((uint)uVar7 == uVar3) {
          if (uVar15 != 0) {
            pcVar21[uVar15].op = '@';
            pcVar21[uVar15].bits = bVar11;
            pcVar21[uVar15].val = 0;
          }
          *table = *table + uVar19;
          goto LAB_00108147;
        }
        uVar7 = (ulong)lens[local_60[uVar8]];
      }
    } while (((uint)uVar7 <= uVar23) || (uVar12 = uVar15 & uVar4, uVar12 == local_c0));
    if (uVar20 == 0) {
      uVar20 = uVar23;
    }
    pcVar21 = pcVar21 + uVar5;
    uVar9 = uVar7 & 0xffffffff;
    iVar16 = 1 << ((char)uVar7 - (char)uVar20 & 0x1fU);
    while ((uVar5 = (uint)uVar9, uVar5 < uVar3 &&
           (iVar18 = iVar16 - (uint)auStack_88[uVar9],
           iVar18 != 0 && (int)(uint)auStack_88[uVar9] <= iVar16))) {
      uVar9 = (ulong)(uVar5 + 1);
      iVar16 = iVar18 * 2;
    }
    uVar24 = (ulong)(uVar5 - uVar20);
    uVar19 = uVar19 + (1 << ((byte)(uVar5 - uVar20) & 0x1f));
    if ((type == LENS && 0x354 < uVar19) || (type == DISTS && 0x250 < uVar19)) {
      return 1;
    }
    pcVar2 = *table;
    pcVar2[uVar12].op = (char)uVar9 - (char)uVar20;
    pcVar2[uVar12].bits = bVar10;
    pcVar2[uVar12].val = (unsigned_short)((uint)((int)pcVar21 - (int)pcVar2) >> 2);
    local_c0 = uVar12;
  } while( true );
}

Assistant:

int ZLIB_INTERNAL inflate_table(type, lens, codes, table, bits, work)
codetype type;
unsigned short FAR *lens;
unsigned codes;
code FAR * FAR *table;
unsigned FAR *bits;
unsigned short FAR *work;
{
    unsigned len;               /* a code's length in bits */
    unsigned sym;               /* index of code symbols */
    unsigned min, max;          /* minimum and maximum code lengths */
    unsigned root;              /* number of index bits for root table */
    unsigned curr;              /* number of index bits for current table */
    unsigned drop;              /* code bits to drop for sub-table */
    int left;                   /* number of prefix codes available */
    unsigned used;              /* code entries in table used */
    unsigned huff;              /* Huffman code */
    unsigned incr;              /* for incrementing code, index */
    unsigned fill;              /* index for replicating entries */
    unsigned low;               /* low bits for current root entry */
    unsigned mask;              /* mask for low root bits */
    code here;                  /* table entry for duplication */
    code FAR *next;             /* next available space in table */
    const unsigned short FAR *base;     /* base value table to use */
    const unsigned short FAR *extra;    /* extra bits table to use */
    unsigned match;             /* use base and extra for symbol >= match */
    unsigned short count[MAXBITS+1];    /* number of codes of each length */
    unsigned short offs[MAXBITS+1];     /* offsets in table for each length */
    static const unsigned short lbase[31] = { /* Length codes 257..285 base */
        3, 4, 5, 6, 7, 8, 9, 10, 11, 13, 15, 17, 19, 23, 27, 31,
        35, 43, 51, 59, 67, 83, 99, 115, 131, 163, 195, 227, 258, 0, 0};
    static const unsigned short lext[31] = { /* Length codes 257..285 extra */
        16, 16, 16, 16, 16, 16, 16, 16, 17, 17, 17, 17, 18, 18, 18, 18,
        19, 19, 19, 19, 20, 20, 20, 20, 21, 21, 21, 21, 16, 77, 202};
    static const unsigned short dbase[32] = { /* Distance codes 0..29 base */
        1, 2, 3, 4, 5, 7, 9, 13, 17, 25, 33, 49, 65, 97, 129, 193,
        257, 385, 513, 769, 1025, 1537, 2049, 3073, 4097, 6145,
        8193, 12289, 16385, 24577, 0, 0};
    static const unsigned short dext[32] = { /* Distance codes 0..29 extra */
        16, 16, 16, 16, 17, 17, 18, 18, 19, 19, 20, 20, 21, 21, 22, 22,
        23, 23, 24, 24, 25, 25, 26, 26, 27, 27,
        28, 28, 29, 29, 64, 64};

    /*
       Process a set of code lengths to create a canonical Huffman code.  The
       code lengths are lens[0..codes-1].  Each length corresponds to the
       symbols 0..codes-1.  The Huffman code is generated by first sorting the
       symbols by length from short to long, and retaining the symbol order
       for codes with equal lengths.  Then the code starts with all zero bits
       for the first code of the shortest length, and the codes are integer
       increments for the same length, and zeros are appended as the length
       increases.  For the deflate format, these bits are stored backwards
       from their more natural integer increment ordering, and so when the
       decoding tables are built in the large loop below, the integer codes
       are incremented backwards.

       This routine assumes, but does not check, that all of the entries in
       lens[] are in the range 0..MAXBITS.  The caller must assure this.
       1..MAXBITS is interpreted as that code length.  zero means that that
       symbol does not occur in this code.

       The codes are sorted by computing a count of codes for each length,
       creating from that a table of starting indices for each length in the
       sorted table, and then entering the symbols in order in the sorted
       table.  The sorted table is work[], with that space being provided by
       the caller.

       The length counts are used for other purposes as well, i.e. finding
       the minimum and maximum length codes, determining if there are any
       codes at all, checking for a valid set of lengths, and looking ahead
       at length counts to determine sub-table sizes when building the
       decoding tables.
     */

    /* accumulate lengths for codes (assumes lens[] all in 0..MAXBITS) */
    for (len = 0; len <= MAXBITS; len++)
        count[len] = 0;
    for (sym = 0; sym < codes; sym++)
        count[lens[sym]]++;

    /* bound code lengths, force root to be within code lengths */
    root = *bits;
    for (max = MAXBITS; max >= 1; max--)
        if (count[max] != 0) break;
    if (root > max) root = max;
    if (max == 0) {                     /* no symbols to code at all */
        here.op = (unsigned char)64;    /* invalid code marker */
        here.bits = (unsigned char)1;
        here.val = (unsigned short)0;
        *(*table)++ = here;             /* make a table to force an error */
        *(*table)++ = here;
        *bits = 1;
        return 0;     /* no symbols, but wait for decoding to report error */
    }
    for (min = 1; min < max; min++)
        if (count[min] != 0) break;
    if (root < min) root = min;

    /* check for an over-subscribed or incomplete set of lengths */
    left = 1;
    for (len = 1; len <= MAXBITS; len++) {
        left <<= 1;
        left -= count[len];
        if (left < 0) return -1;        /* over-subscribed */
    }
    if (left > 0 && (type == CODES || max != 1))
        return -1;                      /* incomplete set */

    /* generate offsets into symbol table for each length for sorting */
    offs[1] = 0;
    for (len = 1; len < MAXBITS; len++)
        offs[len + 1] = offs[len] + count[len];

    /* sort symbols by length, by symbol order within each length */
    for (sym = 0; sym < codes; sym++)
        if (lens[sym] != 0) work[offs[lens[sym]]++] = (unsigned short)sym;

    /*
       Create and fill in decoding tables.  In this loop, the table being
       filled is at next and has curr index bits.  The code being used is huff
       with length len.  That code is converted to an index by dropping drop
       bits off of the bottom.  For codes where len is less than drop + curr,
       those top drop + curr - len bits are incremented through all values to
       fill the table with replicated entries.

       root is the number of index bits for the root table.  When len exceeds
       root, sub-tables are created pointed to by the root entry with an index
       of the low root bits of huff.  This is saved in low to check for when a
       new sub-table should be started.  drop is zero when the root table is
       being filled, and drop is root when sub-tables are being filled.

       When a new sub-table is needed, it is necessary to look ahead in the
       code lengths to determine what size sub-table is needed.  The length
       counts are used for this, and so count[] is decremented as codes are
       entered in the tables.

       used keeps track of how many table entries have been allocated from the
       provided *table space.  It is checked for LENS and DIST tables against
       the constants ENOUGH_LENS and ENOUGH_DISTS to guard against changes in
       the initial root table size constants.  See the comments in inftrees.h
       for more information.

       sym increments through all symbols, and the loop terminates when
       all codes of length max, i.e. all codes, have been processed.  This
       routine permits incomplete codes, so another loop after this one fills
       in the rest of the decoding tables with invalid code markers.
     */

    /* set up for code type */
    switch (type) {
    case CODES:
        base = extra = work;    /* dummy value--not used */
        match = 20;
        break;
    case LENS:
        base = lbase;
        extra = lext;
        match = 257;
        break;
    default:    /* DISTS */
        base = dbase;
        extra = dext;
        match = 0;
    }

    /* initialize state for loop */
    huff = 0;                   /* starting code */
    sym = 0;                    /* starting code symbol */
    len = min;                  /* starting code length */
    next = *table;              /* current table to fill in */
    curr = root;                /* current table index bits */
    drop = 0;                   /* current bits to drop from code for index */
    low = (unsigned)(-1);       /* trigger new sub-table when len > root */
    used = 1U << root;          /* use root table entries */
    mask = used - 1;            /* mask for comparing low */

    /* check available table space */
    if ((type == LENS && used > ENOUGH_LENS) ||
        (type == DISTS && used > ENOUGH_DISTS))
        return 1;

    /* process all codes and make table entries */
    for (;;) {
        /* create table entry */
        here.bits = (unsigned char)(len - drop);
        if (work[sym] + 1U < match) {
            here.op = (unsigned char)0;
            here.val = work[sym];
        }
        else if (work[sym] >= match) {
            here.op = (unsigned char)(extra[work[sym] - match]);
            here.val = base[work[sym] - match];
        }
        else {
            here.op = (unsigned char)(32 + 64);         /* end of block */
            here.val = 0;
        }

        /* replicate for those indices with low len bits equal to huff */
        incr = 1U << (len - drop);
        fill = 1U << curr;
        min = fill;                 /* save offset to next table */
        do {
            fill -= incr;
            next[(huff >> drop) + fill] = here;
        } while (fill != 0);

        /* backwards increment the len-bit code huff */
        incr = 1U << (len - 1);
        while (huff & incr)
            incr >>= 1;
        if (incr != 0) {
            huff &= incr - 1;
            huff += incr;
        }
        else
            huff = 0;

        /* go to next symbol, update count, len */
        sym++;
        if (--(count[len]) == 0) {
            if (len == max) break;
            len = lens[work[sym]];
        }

        /* create new sub-table if needed */
        if (len > root && (huff & mask) != low) {
            /* if first time, transition to sub-tables */
            if (drop == 0)
                drop = root;

            /* increment past last table */
            next += min;            /* here min is 1 << curr */

            /* determine length of next table */
            curr = len - drop;
            left = (int)(1 << curr);
            while (curr + drop < max) {
                left -= count[curr + drop];
                if (left <= 0) break;
                curr++;
                left <<= 1;
            }

            /* check for enough space */
            used += 1U << curr;
            if ((type == LENS && used > ENOUGH_LENS) ||
                (type == DISTS && used > ENOUGH_DISTS))
                return 1;

            /* point entry in root table to sub-table */
            low = huff & mask;
            (*table)[low].op = (unsigned char)curr;
            (*table)[low].bits = (unsigned char)root;
            (*table)[low].val = (unsigned short)(next - *table);
        }
    }

    /* fill in remaining table entry if code is incomplete (guaranteed to have
       at most one remaining entry, since if the code is incomplete, the
       maximum code length that was allowed to get this far is one bit) */
    if (huff != 0) {
        here.op = (unsigned char)64;            /* invalid code marker */
        here.bits = (unsigned char)(len - drop);
        here.val = (unsigned short)0;
        next[huff] = here;
    }

    /* set return parameters */
    *table += used;
    *bits = root;
    return 0;
}